

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cartesian_cubic.hpp
# Opt level: O0

lattice_site __thiscall
sisl::cartesian_cubic<short>::get_nearest_site(cartesian_cubic<short> *this,vector *pt)

{
  CoeffReturnType pdVar1;
  CommaInitializer<Eigen::Matrix<int,__1,_1,_0,__1,_1>_> *this_00;
  DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *in_RDX;
  Index extraout_RDX;
  double dVar2;
  lattice_site lVar3;
  CommaInitializer<Eigen::Matrix<int,__1,_1,_0,__1,_1>_> local_58;
  int local_34;
  undefined1 local_2d;
  int local_2c;
  int local_28;
  int z;
  int y;
  int x;
  vector *pt_local;
  cartesian_cubic<short> *this_local;
  lattice_site *r;
  
  _y = in_RDX;
  pt_local = pt;
  this_local = this;
  pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[](in_RDX,0);
  dVar2 = round(*pdVar1);
  z = (int)dVar2;
  pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[](_y,1);
  dVar2 = round(*pdVar1);
  local_28 = (int)dVar2;
  pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[](_y,2);
  dVar2 = round(*pdVar1);
  local_2c = (int)dVar2;
  local_2d = 0;
  local_34 = 3;
  Eigen::Matrix<int,_-1,_1,_0,_-1,_1>::Matrix<int>((Matrix<int,__1,_1,_0,__1,_1> *)this,&local_34);
  Eigen::DenseBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>::operator<<
            (&local_58,(DenseBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_> *)this,&z);
  this_00 = Eigen::CommaInitializer<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>::operator_
                      (&local_58,&local_28);
  Eigen::CommaInitializer<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>::operator_(this_00,&local_2c);
  Eigen::CommaInitializer<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>::~CommaInitializer(&local_58);
  lVar3.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_rows = extraout_RDX;
  lVar3.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_data = (int *)this;
  return (lattice_site)lVar3.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage;
}

Assistant:

virtual lattice_site get_nearest_site(const vector &pt) const {
            int x = round(pt[0]);
            int y = round(pt[1]);
            int z = round(pt[2]);

            lattice_site r(3);
            r << x, y, z;

            return r;
        }